

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void do_fmlal_idx(float32 *d,void *vn,void *vm,float_status *fpst,uint32_t desc,_Bool fz16)

{
  uint uVar1;
  float32 xb;
  float32 fVar2;
  uint uVar3;
  ulong uVar4;
  float32 *pfVar5;
  ulong uVar6;
  long lVar7;
  uintptr_t i;
  ulong uVar8;
  
  uVar3 = (desc & 0x1f) * 8 + 8;
  uVar8 = (ulong)uVar3;
  uVar1 = desc >> 0xb;
  uVar3 = (uint)(uVar3 == 0x10);
  uVar6 = *(ulong *)((long)vn + (ulong)(uVar1 & uVar3) * 8) >> (sbyte)((~uVar3 & uVar1 & 1) << 5);
  uVar4 = uVar6 ^ 0x8000800080008000;
  if ((desc >> 10 & 1) == 0) {
    uVar4 = uVar6;
  }
  xb = float16_to_float32_by_bits((uint)*(ushort *)((long)vm + (ulong)(uVar1 & 0xe)),fz16);
  pfVar5 = d;
  for (lVar7 = 0; (ulong)((desc & 0x1f) << 5) + 0x20 != lVar7; lVar7 = lVar7 + 0x10) {
    fVar2 = float16_to_float32_by_bits((uint32_t)(uVar4 >> ((byte)lVar7 & 0x3f)),fz16);
    fVar2 = float32_muladd_aarch64(fVar2,xb,*pfVar5,0,fpst);
    *pfVar5 = fVar2;
    pfVar5 = pfVar5 + 1;
  }
  for (; uVar8 < (desc >> 2 & 0xf8) + 8; uVar8 = uVar8 + 8) {
    *(undefined8 *)((long)d + uVar8) = 0;
  }
  return;
}

Assistant:

static void do_fmlal_idx(float32 *d, void *vn, void *vm, float_status *fpst,
                         uint32_t desc, bool fz16)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    int is_s = extract32(desc, SIMD_DATA_SHIFT, 1);
    int is_2 = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    int index = extract32(desc, SIMD_DATA_SHIFT + 2, 3);
    int is_q = oprsz == 16;
    uint64_t n_4;
    float32 m_1;

    /* Pre-load all of the f16 data, avoiding overlap issues.  */
    n_4 = load4_f16(vn, is_q, is_2);

    /* Negate all inputs for FMLSL at once.  */
    if (is_s) {
        n_4 ^= 0x8000800080008000ull;
    }

    m_1 = float16_to_float32_by_bits(((float16 *)vm)[H2(index)], fz16);

    for (i = 0; i < oprsz / 4; i++) {
        float32 n_1 = float16_to_float32_by_bits(n_4 >> (i * 16), fz16);
        d[H4(i)] = float32_muladd(n_1, m_1, d[H4(i)], 0, fpst);
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}